

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ess_enable_scaling_group.cc
# Opt level: O2

int __thiscall
aliyun::Ess::EnableScalingGroup
          (Ess *this,EssEnableScalingGroupRequestType *req,
          EssEnableScalingGroupResponseType *response,EssErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  AliRpcRequest *this_00;
  Value *pVVar3;
  char *pcVar4;
  allocator<char> local_959;
  string local_958;
  allocator<char> local_933;
  allocator<char> local_932;
  allocator<char> local_931;
  Value val;
  string str_response;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar4 = "http";
  if (this->use_tls_ != false) {
    pcVar4 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar4,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,this->version_,(allocator<char> *)&local_958);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,this->appid_,(allocator<char> *)&val);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,this->secret_,&local_959);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_178,&local_198,&local_1b8,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  if (((this->use_tls_ == false) && (pcVar4 = this->proxy_host_, pcVar4 != (char *)0x0)) &&
     (*pcVar4 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,pcVar4,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"Action",(allocator<char> *)&local_958);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"EnableScalingGroup",&local_959);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_218,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"OwnerId",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_278,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_258,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_258);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"ResourceOwnerAccount",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_2b8,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_298,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_298);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"ResourceOwnerId",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_2f8,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2d8,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2d8);
  }
  if ((req->scaling_group_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_318,"ScalingGroupId",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_338,(string *)&req->scaling_group_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_318,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_318);
  }
  if ((req->active_scaling_configuration_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,"ActiveScalingConfigurationId",(allocator<char> *)&local_958);
    std::__cxx11::string::string
              ((string *)&local_378,(string *)&req->active_scaling_configuration_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_358,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_358);
  }
  if ((req->instance_id1)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,"InstanceId.1",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_3b8,(string *)&req->instance_id1);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_398,&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_398);
  }
  if ((req->instance_id2)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d8,"InstanceId.2",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_3f8,(string *)&req->instance_id2);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3d8,&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_3d8);
  }
  if ((req->instance_id3)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_418,"InstanceId.3",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_438,(string *)&req->instance_id3);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_418,&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_418);
  }
  if ((req->instance_id4)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,"InstanceId.4",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_478,(string *)&req->instance_id4);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_458,&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_458);
  }
  if ((req->instance_id5)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_498,"InstanceId.5",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_4b8,(string *)&req->instance_id5);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_498,&local_4b8);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_498);
  }
  if ((req->instance_id6)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d8,"InstanceId.6",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_4f8,(string *)&req->instance_id6);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4d8,&local_4f8);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::__cxx11::string::~string((string *)&local_4d8);
  }
  if ((req->instance_id7)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_518,"InstanceId.7",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_538,(string *)&req->instance_id7);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_518,&local_538);
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::string::~string((string *)&local_518);
  }
  if ((req->instance_id8)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_558,"InstanceId.8",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_578,(string *)&req->instance_id8);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_558,&local_578);
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::string::~string((string *)&local_558);
  }
  if ((req->instance_id9)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_598,"InstanceId.9",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_5b8,(string *)&req->instance_id9);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_598,&local_5b8);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::__cxx11::string::~string((string *)&local_598);
  }
  if ((req->instance_id10)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5d8,"InstanceId.10",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_5f8,(string *)&req->instance_id10);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_5d8,&local_5f8);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::__cxx11::string::~string((string *)&local_5d8);
  }
  if ((req->instance_id11)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_618,"InstanceId.11",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_638,(string *)&req->instance_id11);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_618,&local_638);
    std::__cxx11::string::~string((string *)&local_638);
    std::__cxx11::string::~string((string *)&local_618);
  }
  if ((req->instance_id12)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_658,"InstanceId.12",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_678,(string *)&req->instance_id12);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_658,&local_678);
    std::__cxx11::string::~string((string *)&local_678);
    std::__cxx11::string::~string((string *)&local_658);
  }
  if ((req->instance_id13)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_698,"InstanceId.13",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_6b8,(string *)&req->instance_id13);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_698,&local_6b8);
    std::__cxx11::string::~string((string *)&local_6b8);
    std::__cxx11::string::~string((string *)&local_698);
  }
  if ((req->instance_id14)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d8,"InstanceId.14",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_6f8,(string *)&req->instance_id14);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_6d8,&local_6f8);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::__cxx11::string::~string((string *)&local_6d8);
  }
  if ((req->instance_id15)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_718,"InstanceId.15",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_738,(string *)&req->instance_id15);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_718,&local_738);
    std::__cxx11::string::~string((string *)&local_738);
    std::__cxx11::string::~string((string *)&local_718);
  }
  if ((req->instance_id16)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_758,"InstanceId.16",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_778,(string *)&req->instance_id16);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_758,&local_778);
    std::__cxx11::string::~string((string *)&local_778);
    std::__cxx11::string::~string((string *)&local_758);
  }
  if ((req->instance_id17)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_798,"InstanceId.17",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_7b8,(string *)&req->instance_id17);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_798,&local_7b8);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::__cxx11::string::~string((string *)&local_798);
  }
  if ((req->instance_id18)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7d8,"InstanceId.18",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_7f8,(string *)&req->instance_id18);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_7d8,&local_7f8);
    std::__cxx11::string::~string((string *)&local_7f8);
    std::__cxx11::string::~string((string *)&local_7d8);
  }
  if ((req->instance_id19)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_818,"InstanceId.19",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_838,(string *)&req->instance_id19);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_818,&local_838);
    std::__cxx11::string::~string((string *)&local_838);
    std::__cxx11::string::~string((string *)&local_818);
  }
  if ((req->instance_id20)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_858,"InstanceId.20",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_878,(string *)&req->instance_id20);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_858,&local_878);
    std::__cxx11::string::~string((string *)&local_878);
    std::__cxx11::string::~string((string *)&local_858);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_898,"OwnerAccount",(allocator<char> *)&local_958);
    std::__cxx11::string::string((string *)&local_8b8,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_898,&local_8b8);
    std::__cxx11::string::~string((string *)&local_8b8);
    std::__cxx11::string::~string((string *)&local_898);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8d8,"RegionId",(allocator<char> *)&local_958);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8f8,this->region_id_,&local_959);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_8d8,&local_8f8);
    std::__cxx11::string::~string((string *)&local_8f8);
    std::__cxx11::string::~string((string *)&local_8d8);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (EssErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_958,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_958,anon_var_dwarf_10f6e6 + 9,&local_959);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_958);
        std::__cxx11::string::~string((string *)&local_958);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_958,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_958,anon_var_dwarf_10f6e6 + 9,&local_931);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_958);
        std::__cxx11::string::~string((string *)&local_958);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_958,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_958,anon_var_dwarf_10f6e6 + 9,&local_932);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_958);
        std::__cxx11::string::~string((string *)&local_958);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_958,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_958,anon_var_dwarf_10f6e6 + 9,&local_933);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_958);
        std::__cxx11::string::~string((string *)&local_958);
      }
      goto LAB_00145bac;
    }
  }
  iVar2 = -1;
  if (error_info != (EssErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00145bac:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Ess::EnableScalingGroup(const EssEnableScalingGroupRequestType& req,
                      EssEnableScalingGroupResponseType* response,
                       EssErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","EnableScalingGroup");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.scaling_group_id.empty()) {
    req_rpc->AddRequestQuery("ScalingGroupId", req.scaling_group_id);
  }
  if(!req.active_scaling_configuration_id.empty()) {
    req_rpc->AddRequestQuery("ActiveScalingConfigurationId", req.active_scaling_configuration_id);
  }
  if(!req.instance_id1.empty()) {
    req_rpc->AddRequestQuery("InstanceId.1", req.instance_id1);
  }
  if(!req.instance_id2.empty()) {
    req_rpc->AddRequestQuery("InstanceId.2", req.instance_id2);
  }
  if(!req.instance_id3.empty()) {
    req_rpc->AddRequestQuery("InstanceId.3", req.instance_id3);
  }
  if(!req.instance_id4.empty()) {
    req_rpc->AddRequestQuery("InstanceId.4", req.instance_id4);
  }
  if(!req.instance_id5.empty()) {
    req_rpc->AddRequestQuery("InstanceId.5", req.instance_id5);
  }
  if(!req.instance_id6.empty()) {
    req_rpc->AddRequestQuery("InstanceId.6", req.instance_id6);
  }
  if(!req.instance_id7.empty()) {
    req_rpc->AddRequestQuery("InstanceId.7", req.instance_id7);
  }
  if(!req.instance_id8.empty()) {
    req_rpc->AddRequestQuery("InstanceId.8", req.instance_id8);
  }
  if(!req.instance_id9.empty()) {
    req_rpc->AddRequestQuery("InstanceId.9", req.instance_id9);
  }
  if(!req.instance_id10.empty()) {
    req_rpc->AddRequestQuery("InstanceId.10", req.instance_id10);
  }
  if(!req.instance_id11.empty()) {
    req_rpc->AddRequestQuery("InstanceId.11", req.instance_id11);
  }
  if(!req.instance_id12.empty()) {
    req_rpc->AddRequestQuery("InstanceId.12", req.instance_id12);
  }
  if(!req.instance_id13.empty()) {
    req_rpc->AddRequestQuery("InstanceId.13", req.instance_id13);
  }
  if(!req.instance_id14.empty()) {
    req_rpc->AddRequestQuery("InstanceId.14", req.instance_id14);
  }
  if(!req.instance_id15.empty()) {
    req_rpc->AddRequestQuery("InstanceId.15", req.instance_id15);
  }
  if(!req.instance_id16.empty()) {
    req_rpc->AddRequestQuery("InstanceId.16", req.instance_id16);
  }
  if(!req.instance_id17.empty()) {
    req_rpc->AddRequestQuery("InstanceId.17", req.instance_id17);
  }
  if(!req.instance_id18.empty()) {
    req_rpc->AddRequestQuery("InstanceId.18", req.instance_id18);
  }
  if(!req.instance_id19.empty()) {
    req_rpc->AddRequestQuery("InstanceId.19", req.instance_id19);
  }
  if(!req.instance_id20.empty()) {
    req_rpc->AddRequestQuery("InstanceId.20", req.instance_id20);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}